

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::EliminateDeadMembersPass::FindLiveMembers(EliminateDeadMembersPass *this)

{
  Op OVar1;
  pointer puVar2;
  Instruction *pIVar3;
  bool bVar4;
  uint32_t uVar5;
  Module *pMVar6;
  uint uVar7;
  Instruction *this_00;
  pointer puVar8;
  
  pMVar6 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar3 = (Instruction *)
           ((long)&(pMVar6->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 8);
  this_00 = *(Instruction **)
             ((long)&(pMVar6->types_values_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10)
  ;
  if (this_00 != pIVar3) {
    do {
      OVar1 = this_00->opcode_;
      if (OVar1 == OpTypePointer) {
        uVar5 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar5 = (uint)this_00->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(this_00,uVar5);
        if (uVar5 == 0x14e5) {
          uVar7 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar7 = (uint)this_00->has_result_id_;
          }
          uVar5 = Instruction::GetSingleWordOperand(this_00,uVar7 + 1);
          MarkTypeAsFullyUsed(this,uVar5);
        }
      }
      else if (OVar1 == OpVariable) {
        uVar5 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar5 = (uint)this_00->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(this_00,uVar5);
        if (((uVar5 | 2) == 3) ||
           (bVar4 = Instruction::IsVulkanStorageBufferVariable(this_00), bVar4)) {
          uVar5 = 0;
          if (this_00->has_type_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(this_00,0);
          }
          MarkPointeeTypeAsFullUsed(this,uVar5);
        }
      }
      else if (OVar1 == OpSpecConstantOp) {
        uVar5 = (this_00->has_result_id_ & 1) + 1;
        if (this_00->has_type_id_ == false) {
          uVar5 = (uint)this_00->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(this_00,uVar5);
        if (uVar5 == 0x51) {
          MarkMembersAsLiveForExtract(this,this_00);
        }
        else if ((uVar5 - 0x41 < 3) || (uVar5 == 0x46)) {
          __assert_fail("false && \"Not implemented yet.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x37,"void spvtools::opt::EliminateDeadMembersPass::FindLiveMembers()");
        }
      }
      this_00 = (this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (this_00 != pIVar3);
    pMVar6 = (((this->super_MemPass).super_Pass.context_)->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  }
  puVar2 = *(pointer *)
            ((long)&(pMVar6->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                    ._M_impl + 8);
  for (puVar8 = (pMVar6->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    FindLiveMembers(this,(Function *)
                         (puVar8->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                         ._M_t);
  }
  return;
}

Assistant:

void EliminateDeadMembersPass::FindLiveMembers() {
  // Until we have implemented the rewriting of OpSpecConsantOp instructions,
  // we have to mark them as fully used just to be safe.
  for (auto& inst : get_module()->types_values()) {
    if (inst.opcode() == spv::Op::OpSpecConstantOp) {
      switch (spv::Op(inst.GetSingleWordInOperand(kSpecConstOpOpcodeIdx))) {
        case spv::Op::OpCompositeExtract:
          MarkMembersAsLiveForExtract(&inst);
          break;
        case spv::Op::OpCompositeInsert:
          // Nothing specific to do.
          break;
        case spv::Op::OpAccessChain:
        case spv::Op::OpInBoundsAccessChain:
        case spv::Op::OpPtrAccessChain:
        case spv::Op::OpInBoundsPtrAccessChain:
          assert(false && "Not implemented yet.");
          break;
        default:
          break;
      }
    } else if (inst.opcode() == spv::Op::OpVariable) {
      switch (spv::StorageClass(inst.GetSingleWordInOperand(0))) {
        case spv::StorageClass::Input:
        case spv::StorageClass::Output:
          MarkPointeeTypeAsFullUsed(inst.type_id());
          break;
        default:
          // Ignore structured buffers as layout(offset) qualifiers cannot be
          // applied to structure fields
          if (inst.IsVulkanStorageBufferVariable())
            MarkPointeeTypeAsFullUsed(inst.type_id());
          break;
      }
    } else if (inst.opcode() == spv::Op::OpTypePointer) {
      uint32_t storage_class = inst.GetSingleWordInOperand(0);
      if (storage_class == uint32_t(spv::StorageClass::PhysicalStorageBuffer)) {
        MarkTypeAsFullyUsed(inst.GetSingleWordInOperand(1));
      }
    }
  }

  for (const Function& func : *get_module()) {
    FindLiveMembers(func);
  }
}